

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratrecon.hpp
# Opt level: O3

bool soplex::reconstructVector(VectorRational *input,Rational *denomBoundSquared,DIdxSet *indexSet)

{
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *o;
  uint uVar1;
  pointer pnVar2;
  int iVar3;
  int iVar4;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *pcVar5;
  data_type *pdVar6;
  undefined8 uVar7;
  long lVar8;
  Rational *pRVar9;
  bool bVar10;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  *pnVar11;
  data_type *pdVar12;
  pointer pnVar13;
  Rational *__src;
  bool *pbVar14;
  undefined8 uVar15;
  pointer pnVar16;
  ulong *__src_00;
  ulong uVar17;
  Integer q [3];
  Integer Dbound;
  Integer temp;
  Integer denom;
  Integer p [3];
  Integer tn;
  Integer ai;
  Integer td;
  Integer gcd;
  Integer a0;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  xnum;
  data_type local_408;
  uint local_3f8;
  undefined2 local_3f4;
  char local_3f2;
  undefined1 local_3e8 [16];
  uint local_3d8;
  undefined2 local_3d4;
  bool local_3d2 [4];
  undefined4 uStack_3ce;
  undefined2 uStack_3ca;
  data_type local_3c8;
  uint local_3b8;
  undefined2 local_3b4;
  bool local_3b2 [10];
  undefined1 local_3a8 [16];
  uint local_398;
  byte local_394;
  char local_393;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  local_388;
  data_type local_368;
  uint local_358;
  undefined2 local_354;
  char local_352;
  ulong local_348;
  VectorRational *local_340;
  data_type local_338;
  int local_328;
  undefined2 local_324;
  char local_322;
  undefined1 local_318 [16];
  uint local_308;
  undefined2 local_304;
  bool local_302 [4];
  undefined4 uStack_2fe;
  undefined2 uStack_2fa;
  data_type local_2f8;
  uint local_2e8;
  undefined1 local_2e4;
  bool abStack_2e3 [19];
  bool *local_2d0;
  uint local_2c8;
  undefined1 local_2c4;
  char local_2c3;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  local_2b8;
  data_type local_298;
  uint local_288;
  undefined2 local_284;
  byte local_282;
  pointer local_270;
  data_type local_268;
  int local_258;
  undefined2 local_254;
  char local_252;
  data_type local_248;
  uint local_238;
  undefined2 local_234;
  byte local_232;
  data_type local_228;
  uint local_218;
  undefined2 local_214;
  byte local_212;
  ulong local_200;
  data_type local_1f8;
  int local_1e8;
  undefined2 local_1e4;
  char local_1e2;
  Rational *local_1d8;
  DIdxSet *local_1d0;
  data_type local_1c8;
  uint local_1b8;
  undefined1 local_1b4;
  byte local_1b3;
  byte local_1b2;
  data_type local_1a8;
  uint local_198;
  undefined1 local_194;
  byte local_193;
  byte local_192;
  data_type local_188;
  uint local_178;
  undefined1 local_174;
  byte local_173;
  byte local_172;
  data_type local_168;
  uint local_158;
  undefined1 local_154;
  byte local_153;
  byte local_152;
  data_type local_148;
  uint local_138;
  undefined1 local_134;
  byte local_133;
  byte local_132;
  data_type local_128;
  uint local_118;
  undefined1 local_114;
  byte local_113;
  byte local_112;
  data_type local_108;
  uint local_f8;
  undefined1 local_f4;
  byte local_f3;
  byte local_f2;
  data_type local_e8;
  uint local_d8;
  undefined1 local_d4;
  byte local_d3;
  byte local_d2;
  data_type local_c8;
  uint local_b8;
  undefined1 local_b4;
  byte local_b3;
  byte local_b2;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_a0;
  data_type local_88;
  char local_73;
  char local_72;
  uint local_68 [2];
  void *local_60;
  char local_53;
  char local_52;
  expression<boost::multiprecision::detail::negate,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
  local_40;
  expression<boost::multiprecision::detail::negate,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void,_void>
  local_38;
  
  local_1d8 = denomBoundSquared;
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::vector(&local_a0,
           (long)(int)((ulong)((long)(input->val).
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(input->val).
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 6),
           (allocator_type *)&local_2f8.ld);
  local_318._0_8_ = 1;
  local_308 = 1;
  local_304._0_1_ = false;
  local_304._1_1_ = true;
  local_302[0] = false;
  local_270 = (pointer)((ulong)((long)(input->val).
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(input->val).
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 6);
  local_340 = input;
  local_1d0 = indexSet;
  if (indexSet == (DIdxSet *)0x0) {
    if (0 < (int)(uint)local_270) {
      uVar17 = (ulong)((uint)local_270 & 0x7fffffff);
      lVar8 = 0x20;
      do {
        local_c8.la[0] = 0;
        local_b8 = 0;
        if (local_302[0] != false) {
          local_b8 = local_308;
        }
        local_b4 = local_304._0_1_;
        local_b3 = local_302[0] ^ 1;
        local_b2 = local_302[0];
        if (local_302[0] == true) {
          local_c8.la[0] = local_318._0_8_;
          local_c8.ld.data = (limb_pointer)local_318._8_8_;
        }
        else {
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)&local_c8.ld,local_308,local_308);
          uVar7 = &local_c8;
          if (local_b3 == 0) {
            uVar7 = local_c8.ld.data;
          }
          pdVar12 = (data_type *)local_318;
          if (local_304._1_1_ == false) {
            pdVar12 = (data_type *)local_318._8_8_;
          }
          memcpy((void *)uVar7,pdVar12,(ulong)local_308 << 3);
        }
        pnVar2 = (local_340->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __src_00 = (ulong *)((long)&(pnVar2->m_backend).m_value + lVar8);
        local_e8.la[0] = 0;
        local_d2 = *(byte *)((long)&(pnVar2->m_backend).m_value + lVar8 + 0x16);
        uVar1 = *(uint *)((long)&(pnVar2->m_backend).m_value + lVar8 + 0x10);
        local_d8 = 0;
        if (local_d2 != 0) {
          local_d8 = uVar1;
        }
        local_d4 = *(undefined1 *)((long)&(pnVar2->m_backend).m_value + lVar8 + 0x14);
        local_d3 = local_d2 ^ 1;
        if (local_d2 == 1) {
          local_e8.la[0] = *__src_00;
          local_e8.ld.data = (limb_pointer)__src_00[1];
        }
        else {
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)&local_e8.ld,uVar1,uVar1);
          uVar7 = &local_e8;
          if (local_d3 == 0) {
            uVar7 = local_e8.ld.data;
          }
          if (*(char *)((long)&(pnVar2->m_backend).m_value + lVar8 + 0x15) == '\0') {
            __src_00 = *(ulong **)((long)&(pnVar2->m_backend).m_value + lVar8 + 8);
          }
          memcpy((void *)uVar7,__src_00,
                 (ulong)*(uint *)((long)&(pnVar2->m_backend).m_value + lVar8 + 0x10) << 3);
        }
        boost::multiprecision::default_ops::
        eval_lcm<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)local_318,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_c8.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_e8.ld);
        if ((local_d3 == 0) && (local_d2 == 0)) {
          operator_delete(local_e8.ld.data,(local_e8.la[0] & 0xffffffff) << 3);
        }
        if ((local_b3 == 0) && (local_b2 == 0)) {
          operator_delete(local_c8.ld.data,(local_c8.la[0] & 0xffffffff) << 3);
        }
        lVar8 = lVar8 + 0x40;
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
      if (0 < (int)(uint)local_270) {
        local_200 = (ulong)((uint)local_270 & 0x7fffffff);
        uVar17 = 0;
        do {
          pnVar13 = (local_340->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar2 = pnVar13 + uVar17;
          local_3c8.la[0] = 0;
          local_3b2[0] = *(bool *)((long)&pnVar13[uVar17].m_backend.m_value + 0x16);
          uVar1 = *(uint *)((long)&pnVar13[uVar17].m_backend.m_value + 0x10);
          local_3b8 = 0;
          if (local_3b2[0] != false) {
            local_3b8 = uVar1;
          }
          local_3b4 = CONCAT11(local_3b2[0],
                               *(bool *)((long)&pnVar13[uVar17].m_backend.m_value + 0x14)) ^ 0x100;
          if (local_3b2[0] == true) {
            local_3c8.la[0] = *(undefined8 *)&(pnVar2->m_backend).m_value;
            local_3c8.ld.data =
                 (limb_pointer)*(undefined8 *)((long)&(pnVar2->m_backend).m_value + 8);
          }
          else {
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_3c8.ld,uVar1,uVar1);
            uVar7 = &local_3c8;
            if (local_3b4._1_1_ == '\0') {
              uVar7 = local_3c8.ld.data;
            }
            pnVar13 = pnVar2;
            if (*(bool *)((long)&(pnVar2->m_backend).m_value + 0x15) == false) {
              pnVar13 = *(pointer *)((long)&(pnVar2->m_backend).m_value + 8);
            }
            memcpy((void *)uVar7,pnVar13,
                   (ulong)*(uint *)((long)&(pnVar2->m_backend).m_value + 0x10) << 3);
          }
          local_408.la[0] = (limb_type)local_318;
          local_408.ld.data = (limb_pointer)&local_3c8;
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
          ::
          number<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>
                    ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                      *)&local_2f8.ld,
                     (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                      *)&local_408.ld,(type *)0x0);
          local_348 = uVar17;
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       *)(local_a0.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar17),
                      (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       *)&local_2f8.ld);
          if ((abStack_2e3[0] == false) && (abStack_2e3[1] == false)) {
            operator_delete(local_2f8.ld.data,(local_2f8.la[0] & 0xffffffff) << 3);
          }
          if ((local_3b4._1_1_ == '\0') && (local_3b2[0] == false)) {
            operator_delete(local_3c8.ld.data,(local_3c8.la[0] & 0xffffffff) << 3);
          }
          pnVar16 = local_a0.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar17;
          pnVar2 = (local_340->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar11 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                     *)((long)&pnVar2[uVar17].m_backend.m_value + 0x20);
          local_3c8.la[0] = 0;
          local_3b2[0] = *(bool *)((long)&pnVar2[uVar17].m_backend.m_value + 0x36);
          uVar1 = *(uint *)((long)&pnVar2[uVar17].m_backend.m_value + 0x30);
          local_3b8 = 0;
          if (local_3b2[0] != false) {
            local_3b8 = uVar1;
          }
          local_3b4 = CONCAT11(local_3b2[0],
                               *(bool *)((long)&pnVar2[uVar17].m_backend.m_value + 0x34)) ^ 0x100;
          if (local_3b2[0] == true) {
            local_3c8.la[0] =
                 *(undefined8 *)
                  &(pnVar11->m_backend).
                   super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ;
            local_3c8.ld.data =
                 (limb_pointer)*(undefined8 *)((long)&pnVar2[uVar17].m_backend.m_value + 0x28);
          }
          else {
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_3c8.ld,uVar1,uVar1);
            uVar7 = &local_3c8;
            if (local_3b4._1_1_ == '\0') {
              uVar7 = local_3c8.ld.data;
            }
            if (*(bool *)((long)&pnVar2[uVar17].m_backend.m_value + 0x35) == false) {
              pnVar11 = *(number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                          **)((long)&pnVar2[uVar17].m_backend.m_value + 0x28);
            }
            memcpy((void *)uVar7,pnVar11,
                   (ulong)*(uint *)((long)&pnVar2[uVar17].m_backend.m_value + 0x30) << 3);
          }
          local_408.ld.data = (limb_pointer)&local_3c8;
          local_408.la[0] = (limb_type)pnVar16;
          boost::multiprecision::
          number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
          ::
          number<boost::multiprecision::detail::divide_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>
                    ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                      *)&local_2f8.ld,
                     (expression<boost::multiprecision::detail::divide_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                      *)&local_408.ld,(type *)0x0);
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       *)(local_a0.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar17),
                      (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       *)&local_2f8.ld);
          if ((abStack_2e3[0] == false) && (abStack_2e3[1] == false)) {
            operator_delete(local_2f8.ld.data,(local_2f8.la[0] & 0xffffffff) << 3);
          }
          uVar17 = local_348;
          if ((local_3b4._1_1_ == '\0') && (local_3b2[0] == false)) {
            operator_delete(local_3c8.ld.data,(local_3c8.la[0] & 0xffffffff) << 3);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != local_200);
      }
    }
  }
  else if (0 < (indexSet->super_IdxSet).num) {
    lVar8 = 0;
    do {
      local_108.la[0] = 0;
      local_f8 = 0;
      if (local_302[0] != false) {
        local_f8 = local_308;
      }
      local_f4 = local_304._0_1_;
      local_f3 = local_302[0] ^ 1;
      local_f2 = local_302[0];
      if (local_302[0] == true) {
        local_108.la[0] = local_318._0_8_;
        local_108.ld.data = (limb_pointer)local_318._8_8_;
      }
      else {
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_108.ld,local_308,local_308);
        uVar7 = &local_108;
        if (local_f3 == 0) {
          uVar7 = local_108.ld.data;
        }
        pdVar12 = (data_type *)local_318;
        if (local_304._1_1_ == false) {
          pdVar12 = (data_type *)local_318._8_8_;
        }
        memcpy((void *)uVar7,pdVar12,(ulong)local_308 << 3);
      }
      iVar3 = (indexSet->super_IdxSet).idx[lVar8];
      pnVar2 = (local_340->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar11 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                 *)((long)&pnVar2[iVar3].m_backend.m_value + 0x20);
      local_128.la[0] = 0;
      local_112 = *(bool *)((long)&pnVar2[iVar3].m_backend.m_value + 0x36);
      uVar1 = *(uint *)((long)&pnVar2[iVar3].m_backend.m_value + 0x30);
      local_118 = 0;
      if ((bool)local_112 != false) {
        local_118 = uVar1;
      }
      local_114 = *(bool *)((long)&pnVar2[iVar3].m_backend.m_value + 0x34);
      local_113 = local_112 ^ 1;
      if ((bool)local_112 == true) {
        local_128.la[0] =
             *(undefined8 *)
              &(pnVar11->m_backend).
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ;
        local_128.ld.data =
             (limb_pointer)*(undefined8 *)((long)&pnVar2[iVar3].m_backend.m_value + 0x28);
      }
      else {
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_128.ld,uVar1,uVar1);
        uVar7 = &local_128;
        if (local_113 == 0) {
          uVar7 = local_128.ld.data;
        }
        if (*(bool *)((long)&pnVar2[iVar3].m_backend.m_value + 0x35) == false) {
          pnVar11 = *(number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                      **)((long)&pnVar2[iVar3].m_backend.m_value + 0x28);
        }
        memcpy((void *)uVar7,pnVar11,
               (ulong)*(uint *)((long)&pnVar2[iVar3].m_backend.m_value + 0x30) << 3);
      }
      boost::multiprecision::default_ops::
      eval_lcm<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)local_318,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_108.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_128.ld);
      indexSet = local_1d0;
      if ((local_113 == 0) && (local_112 == 0)) {
        operator_delete(local_128.ld.data,(local_128.la[0] & 0xffffffff) << 3);
      }
      if ((local_f3 == 0) && (local_f2 == 0)) {
        operator_delete(local_108.ld.data,(local_108.la[0] & 0xffffffff) << 3);
      }
      lVar8 = lVar8 + 1;
      iVar3 = (indexSet->super_IdxSet).num;
    } while (lVar8 < iVar3);
    if (0 < iVar3) {
      uVar17 = 0;
      do {
        iVar3 = (indexSet->super_IdxSet).idx[uVar17];
        pnVar13 = (local_340->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar2 = pnVar13 + iVar3;
        local_3c8.la[0] = 0;
        local_3b2[0] = *(bool *)((long)&pnVar13[iVar3].m_backend.m_value + 0x16);
        uVar1 = *(uint *)((long)&pnVar13[iVar3].m_backend.m_value + 0x10);
        local_3b8 = 0;
        if (local_3b2[0] != false) {
          local_3b8 = uVar1;
        }
        local_3b4 = CONCAT11(local_3b2[0],*(bool *)((long)&pnVar13[iVar3].m_backend.m_value + 0x14))
                    ^ 0x100;
        if (local_3b2[0] == true) {
          local_3c8.la[0] = *(undefined8 *)&(pnVar2->m_backend).m_value;
          local_3c8.ld.data = (limb_pointer)*(undefined8 *)((long)&(pnVar2->m_backend).m_value + 8);
        }
        else {
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)&local_3c8.ld,uVar1,uVar1);
          uVar7 = &local_3c8;
          if (local_3b4._1_1_ == '\0') {
            uVar7 = local_3c8.ld.data;
          }
          pnVar13 = pnVar2;
          if (*(bool *)((long)&(pnVar2->m_backend).m_value + 0x15) == false) {
            pnVar13 = *(pointer *)((long)&(pnVar2->m_backend).m_value + 8);
          }
          memcpy((void *)uVar7,pnVar13,
                 (ulong)*(uint *)((long)&(pnVar2->m_backend).m_value + 0x10) << 3);
        }
        local_408.la[0] = (limb_type)local_318;
        local_408.ld.data = (limb_pointer)&local_3c8;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::multiply_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>
                  ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_2f8.ld,
                   (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_408.ld,(type *)0x0);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)(local_a0.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar3),
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_2f8.ld);
        if ((abStack_2e3[0] == false) && (abStack_2e3[1] == false)) {
          operator_delete(local_2f8.ld.data,(local_2f8.la[0] & 0xffffffff) << 3);
        }
        local_348 = uVar17;
        if ((local_3b4._1_1_ == '\0') && (local_3b2[0] == false)) {
          operator_delete(local_3c8.ld.data,(local_3c8.la[0] & 0xffffffff) << 3);
        }
        pnVar16 = local_a0.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar3;
        pnVar2 = (local_340->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar11 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                   *)((long)&pnVar2[iVar3].m_backend.m_value + 0x20);
        local_3c8.la[0] = 0;
        local_3b2[0] = *(bool *)((long)&pnVar2[iVar3].m_backend.m_value + 0x36);
        uVar1 = *(uint *)((long)&pnVar2[iVar3].m_backend.m_value + 0x30);
        local_3b8 = 0;
        if (local_3b2[0] != false) {
          local_3b8 = uVar1;
        }
        local_3b4 = CONCAT11(local_3b2[0],*(bool *)((long)&pnVar2[iVar3].m_backend.m_value + 0x34))
                    ^ 0x100;
        if (local_3b2[0] == true) {
          local_3c8.la[0] =
               *(undefined8 *)
                &(pnVar11->m_backend).
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ;
          local_3c8.ld.data =
               (limb_pointer)*(undefined8 *)((long)&pnVar2[iVar3].m_backend.m_value + 0x28);
        }
        else {
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)&local_3c8.ld,uVar1,uVar1);
          uVar7 = &local_3c8;
          if (local_3b4._1_1_ == '\0') {
            uVar7 = local_3c8.ld.data;
          }
          if (*(bool *)((long)&pnVar2[iVar3].m_backend.m_value + 0x35) == false) {
            pnVar11 = *(number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                        **)((long)&pnVar2[iVar3].m_backend.m_value + 0x28);
          }
          memcpy((void *)uVar7,pnVar11,
                 (ulong)*(uint *)((long)&pnVar2[iVar3].m_backend.m_value + 0x30) << 3);
        }
        local_408.ld.data = (limb_pointer)&local_3c8;
        local_408.la[0] = (limb_type)pnVar16;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::divide_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>
                  ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_2f8.ld,
                   (expression<boost::multiprecision::detail::divide_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_408.ld,(type *)0x0);
        indexSet = local_1d0;
        uVar17 = local_348;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)(local_a0.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar3),
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_2f8.ld);
        if ((abStack_2e3[0] == false) && (abStack_2e3[1] == false)) {
          operator_delete(local_2f8.ld.data,(local_2f8.la[0] & 0xffffffff) << 3);
        }
        if ((local_3b4._1_1_ == '\0') && (local_3b2[0] == false)) {
          operator_delete(local_3c8.ld.data,(local_3c8.la[0] & 0xffffffff) << 3);
        }
        uVar17 = uVar17 + 1;
      } while ((long)uVar17 < (long)(indexSet->super_IdxSet).num);
    }
  }
  local_1a8.la[0] = 0;
  local_198 = 0;
  if (local_302[0] != false) {
    local_198 = local_308;
  }
  local_194 = local_304._0_1_;
  local_193 = local_302[0] ^ 1;
  local_192 = local_302[0];
  if (local_302[0] == true) {
    local_1a8.la[0] = local_318._0_8_;
    local_1a8.ld.data = (limb_pointer)local_318._8_8_;
    pRVar9 = local_1d8;
  }
  else {
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_1a8.ld,local_308,local_308);
    pRVar9 = local_1d8;
    uVar7 = &local_1a8;
    if (local_193 == 0) {
      uVar7 = local_1a8.ld.data;
    }
    pdVar12 = (data_type *)local_318._8_8_;
    if (local_304._1_1_ != false) {
      pdVar12 = (data_type *)local_318;
    }
    memcpy((void *)uVar7,pdVar12,(ulong)local_308 << 3);
  }
  local_338.la[0] = 0;
  local_328 = 1;
  local_324 = 0x100;
  local_322 = '\0';
  local_248.la[0] = 0;
  local_238 = 1;
  local_234 = 0x100;
  local_232 = 0;
  local_298.la[0] = 0;
  local_288 = 1;
  local_284 = 0x100;
  local_282 = 0;
  local_368.la[0] = 0;
  local_358 = 1;
  local_354 = 0x100;
  local_352 = '\0';
  local_228.la[0] = 1;
  local_218 = 1;
  local_214 = 0x100;
  local_212 = 0;
  local_3c8.la[0] = 0;
  local_3b2[0] = (pRVar9->m_backend).m_value.num.m_backend.
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_alias;
  uVar1 = (pRVar9->m_backend).m_value.num.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_limbs;
  local_3b8 = 0;
  if (local_3b2[0] != false) {
    local_3b8 = uVar1;
  }
  local_3b4 = CONCAT11(local_3b2[0],
                       (pRVar9->m_backend).m_value.num.m_backend.
                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       .m_sign) ^ 0x100;
  if (local_3b2[0] == true) {
    local_3c8.la[0] =
         (pRVar9->m_backend).m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.la[0];
    local_3c8.ld.data =
         (pRVar9->m_backend).m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.ld.data;
  }
  else {
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_3c8.ld,uVar1,uVar1);
    uVar7 = &local_3c8;
    if (local_3b4._1_1_ == '\0') {
      uVar7 = local_3c8.ld.data;
    }
    __src = pRVar9;
    if ((pRVar9->m_backend).m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal == false) {
      __src = (Rational *)
              (pRVar9->m_backend).m_value.num.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_data.ld.data;
    }
    memcpy((void *)uVar7,__src,
           (ulong)(pRVar9->m_backend).m_value.num.m_backend.
                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  .m_limbs << 3);
  }
  pnVar11 = &(pRVar9->m_backend).m_value.den;
  local_408.la[0] = 0;
  local_3f2 = (pRVar9->m_backend).m_value.den.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_alias;
  uVar1 = (pRVar9->m_backend).m_value.den.m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_limbs;
  local_3f8 = 0;
  if ((bool)local_3f2 != false) {
    local_3f8 = uVar1;
  }
  local_3f4 = CONCAT11(local_3f2,
                       (pRVar9->m_backend).m_value.den.m_backend.
                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       .m_sign) ^ 0x100;
  if ((bool)local_3f2 == true) {
    local_408.la[0] =
         (pnVar11->m_backend).
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.la[0];
    local_408.ld.data =
         (pRVar9->m_backend).m_value.den.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_data.ld.data;
  }
  else {
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_408.ld,uVar1,uVar1);
    uVar7 = &local_408;
    if (local_3f4._1_1_ == '\0') {
      uVar7 = local_408.ld.data;
    }
    if ((pRVar9->m_backend).m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal == false) {
      pnVar11 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                 *)(pRVar9->m_backend).m_value.den.m_backend.
                   super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   .m_data.ld.data;
    }
    memcpy((void *)uVar7,pnVar11,
           (ulong)(pRVar9->m_backend).m_value.den.m_backend.
                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  .m_limbs << 3);
  }
  local_88.la[0] = (limb_type)&local_3c8;
  local_88.ld.data = (limb_pointer)&local_408;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
  ::
  number<boost::multiprecision::detail::divide_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>
            ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
              *)&local_2f8.ld,
             (expression<boost::multiprecision::detail::divide_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
              *)&local_88.ld,(type *)0x0);
  if ((local_354._1_1_ == '\0') && (local_352 == '\0')) {
    operator_delete(local_368.ld.data,(local_368.la[0] & 0xffffffff) << 3);
  }
  local_358 = local_2e8;
  local_354._1_1_ = abStack_2e3[0];
  local_352 = abStack_2e3[1];
  if (abStack_2e3[0] == false) {
    local_368.la[0] = local_2f8.la[0];
    local_368.ld.data = local_2f8.ld.data;
    local_2e8 = 0;
    _local_2e4 = CONCAT11(1,local_2e4);
  }
  else {
    memcpy(&local_368,&local_2f8,(ulong)local_2e8 << 3);
  }
  if ((local_3f4._1_1_ == '\0') && (local_3f2 == '\0')) {
    operator_delete(local_408.ld.data,(local_408.la[0] & 0xffffffff) << 3);
  }
  if ((local_3b4._1_1_ == '\0') && (local_3b2[0] == false)) {
    operator_delete(local_3c8.ld.data,(local_3c8.la[0] & 0xffffffff) << 3);
  }
  local_3c8.la[0] = 0;
  local_3b8 = 1;
  local_3b4._0_1_ = 0;
  local_3b4._1_1_ = '\x01';
  local_3b2[0] = false;
  local_2f8.la[0] = 0;
  local_2e8 = 1;
  local_2e4 = 0;
  abStack_2e3[0] = true;
  abStack_2e3[1] = false;
  boost::multiprecision::default_ops::
  eval_integer_sqrt<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
              *)&local_3c8.ld,
             (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
              *)&local_2f8.ld,
             (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
              *)&local_368.ld);
  if ((abStack_2e3[0] == false) && (abStack_2e3[1] == false)) {
    operator_delete(local_2f8.ld.data,(local_2f8.la[0] & 0xffffffff) << 3);
  }
  if ((local_354._1_1_ == '\0') && (local_352 == '\0')) {
    operator_delete(local_368.ld.data,(local_368.la[0] & 0xffffffff) << 3);
  }
  local_358 = local_3b8;
  local_354._0_1_ = (byte)local_3b4;
  local_354._1_1_ = local_3b4._1_1_;
  local_352 = local_3b2[0];
  if (local_3b4._1_1_ == '\0') {
    local_368.la[0] = local_3c8.la[0];
    local_368.ld.data = local_3c8.ld.data;
  }
  else {
    memcpy(&local_368,&local_3c8,(ulong)local_3b8 << 3);
  }
  if (((byte)local_354 & 1) == 0) {
    if (1 < local_358) goto LAB_00326c1b;
    uVar7 = &local_368;
    if (local_354._1_1_ == '\0') {
      uVar7 = local_368.ld.data;
    }
    if (0xffffff < ((data_type *)&((limb_data *)uVar7)->capacity)->la[0]) goto LAB_00326c1b;
  }
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            *)&local_368.ld,1,1);
  uVar7 = &local_368;
  if (local_354._1_1_ == '\0') {
    uVar7 = local_368.ld.data;
  }
  ((data_type *)&((limb_data *)uVar7)->capacity)->la[0] = 0x1000000;
  local_354._0_1_ = 0;
LAB_00326c1b:
  local_1f8.la[0] = 0;
  local_1e8 = 1;
  local_1e4 = 0x100;
  local_1e2 = '\0';
  local_268.la[0] = 0;
  local_258 = 1;
  local_254 = 0x100;
  local_252 = '\0';
  lVar8 = 0x16;
  do {
    *(undefined8 *)(local_318 + lVar8 + 10) = 0;
    *(undefined4 *)((long)&uStack_2fe + lVar8) = 1;
    *(undefined2 *)((long)&uStack_2fa + lVar8) = 0x100;
    *(undefined1 *)((long)&local_2f8 + lVar8) = 0;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0x76);
  lVar8 = 0x16;
  do {
    *(undefined8 *)(local_3e8 + lVar8 + 10) = 0;
    *(undefined4 *)((long)&uStack_3ce + lVar8) = 1;
    *(undefined2 *)((long)&uStack_3ca + lVar8) = 0x100;
    *(undefined1 *)((long)&local_3c8 + lVar8) = 0;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0x76);
  pdVar12 = (data_type *)(local_3b2 + 10);
  local_1d8 = (Rational *)(long)(int)(uint)local_270;
  local_200 = 0;
  local_270 = local_a0.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pnVar16 = local_a0.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if ((local_1d0 != (DIdxSet *)0x0) ||
       (iVar3 = (int)local_200, (long)local_1d8 <= (long)local_200)) {
      bVar10 = true;
      if ((local_1d0 == (DIdxSet *)0x0) || ((long)(local_1d0->super_IdxSet).num <= (long)local_200))
      goto LAB_00327c22;
      iVar3 = (local_1d0->super_IdxSet).idx[local_200];
    }
    local_348 = (ulong)iVar3;
    o = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         *)(pnVar16 + local_348);
    if ((pnVar16[local_348].m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_sign == false) &&
       (pnVar16[local_348].m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_limbs == 1)) {
      pcVar5 = o;
      if (o->m_internal == false) {
        pcVar5 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)(o->m_data).la[1];
      }
      if ((pcVar5->m_data).la[0] != 0) goto LAB_00326d87;
    }
    else {
LAB_00326d87:
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_298.ld,o);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_248.ld,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_1a8.ld);
      local_148.la[0] = 0;
      local_138 = 0;
      if (local_282 != 0) {
        local_138 = local_288;
      }
      local_134 = (char)local_284;
      local_133 = local_282 ^ 1;
      local_132 = local_282;
      if (local_282 == 1) {
        local_148.la[0] = local_298.la[0];
        local_148.ld.data = local_298.ld.data;
      }
      else {
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_148.ld,local_288,local_288);
        uVar7 = &local_148;
        if (local_133 == 0) {
          uVar7 = local_148.ld.data;
        }
        uVar15 = &local_298;
        if (local_284._1_1_ == '\0') {
          uVar15 = local_298.ld.data;
        }
        memcpy((void *)uVar7,(void *)uVar15,(ulong)local_288 << 3);
      }
      local_168.la[0] = 0;
      local_158 = 0;
      if (local_232 != 0) {
        local_158 = local_238;
      }
      local_154 = (byte)local_234;
      local_153 = local_232 ^ 1;
      local_152 = local_232;
      if (local_232 == 1) {
        local_168.la[0] = local_248.la[0];
        local_168.ld.data = local_248.ld.data;
      }
      else {
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_168.ld,local_238,local_238);
        uVar7 = &local_168;
        if (local_153 == 0) {
          uVar7 = local_168.ld.data;
        }
        uVar15 = &local_248;
        if (local_234._1_1_ == '\0') {
          uVar15 = local_248.ld.data;
        }
        memcpy((void *)uVar7,(void *)uVar15,(ulong)local_238 << 3);
      }
      boost::multiprecision::backends::
      eval_gcd<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_338.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_148.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_168.ld);
      if ((local_153 == 0) && (local_152 == 0)) {
        operator_delete(local_168.ld.data,(local_168.la[0] & 0xffffffff) << 3);
      }
      if ((local_133 == 0) && (local_132 == 0)) {
        operator_delete(local_148.ld.data,(local_148.la[0] & 0xffffffff) << 3);
      }
      local_408.la[0] = (limb_type)&local_298;
      local_408.ld.data = (limb_pointer)&local_338;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::divide_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>>
                ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                  *)local_408.la[0],
                 (expression<boost::multiprecision::detail::divide_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                  *)&local_408.ld,(divide_immediates *)&local_88.ld);
      local_408._0_8_ = &local_248;
      local_408.ld.data = (limb_pointer)&local_338;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
      ::
      do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::divide_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>>
                ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                  *)&local_248.ld,
                 (expression<boost::multiprecision::detail::divide_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                  *)&local_408.ld,(divide_immediates *)&local_88.ld);
      if ((byte)local_234 == (byte)local_354) {
        iVar4 = boost::multiprecision::backends::
                cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                ::
                compare_unsigned<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                          ((cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                            *)&local_248.ld,
                           (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                            *)&local_368.ld);
        iVar3 = -iVar4;
        if ((byte)local_234 == '\0') {
          iVar3 = iVar4;
        }
        if (iVar3 < 1) {
LAB_003272c8:
          local_408.la[0] = 0;
          local_3f8 = 1;
          local_3f4 = 0x100;
          local_3f2 = '\0';
          local_3e8._0_8_ = 1;
          local_3d8 = 1;
          local_3d4._0_1_ = false;
          local_3d4._1_1_ = true;
          local_3d2[0] = false;
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
          ::
          assign<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                    ((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                      *)&local_408.ld,
                     (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                      *)&local_298.ld,
                     (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                      *)&local_248.ld);
          uVar17 = local_348;
          pnVar2 = (local_340->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       *)(pnVar2 + local_348),
                      (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       *)&local_408.ld);
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       *)((long)&pnVar2[uVar17].m_backend.m_value + 0x20),
                      (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                       *)local_3e8);
          if ((local_3d4._1_1_ == false) && (local_3d2[0] == false)) {
            operator_delete((void *)local_3e8._8_8_,(local_3e8._0_8_ & 0xffffffff) << 3);
          }
          pnVar16 = local_270;
          if ((local_3f4._1_1_ == '\0') && (local_3f2 == '\0')) {
            operator_delete(local_408.ld.data,(local_408.la[0] & 0xffffffff) << 3);
          }
          goto LAB_00327c13;
        }
      }
      else if ((byte)local_234 != 0) goto LAB_003272c8;
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_338.ld,1,1);
      uVar7 = &local_338;
      if (local_324._1_1_ == '\0') {
        uVar7 = local_338.ld.data;
      }
      *(undefined8 *)&((limb_data *)uVar7)->capacity = 1;
      local_324 = local_324 & 0xff00;
      boost::multiprecision::backends::
      divide_unsigned_helper<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_1f8.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_298.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_248.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_338.ld);
      local_1e4 = CONCAT11(local_1e4._1_1_,(char)local_284 != (byte)local_234);
      if (((char)local_284 != (byte)local_234) && (local_1e8 == 1)) {
        uVar7 = &local_1f8;
        if (local_1e4._1_1_ == 0) {
          uVar7 = local_1f8.ld.data;
        }
        if (*(limb_type *)uVar7 == 0) {
          local_1e4 = (ushort)local_1e4._1_1_ << 8;
        }
      }
      local_324._0_1_ = (char)local_284;
      if (((char)local_284 != '\0') && (local_328 == 1)) {
        uVar7 = &local_338;
        if (local_324._1_1_ == 0) {
          uVar7 = local_338.ld.data;
        }
        if (*(long *)&((limb_data *)uVar7)->capacity == 0) {
          local_324._0_1_ = '\0';
        }
      }
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_298.ld,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_248.ld);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_248.ld,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_338.ld);
      boost::multiprecision::backends::
      divide_unsigned_helper<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_268.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_298.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_248.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_338.ld);
      local_254 = CONCAT11(local_254._1_1_,(char)local_284 != (byte)local_234);
      if (((char)local_284 != (byte)local_234) && (local_258 == 1)) {
        uVar7 = &local_268;
        if (local_254._1_1_ == 0) {
          uVar7 = local_268.ld.data;
        }
        if (*(limb_type *)uVar7 == 0) {
          local_254 = (ushort)local_254._1_1_ << 8;
        }
      }
      local_324 = CONCAT11(local_324._1_1_,(char)local_284);
      if (((char)local_284 != '\0') && (local_328 == 1)) {
        uVar7 = &local_338;
        if (local_324._1_1_ == 0) {
          uVar7 = local_338.ld.data;
        }
        if (*(long *)&((limb_data *)uVar7)->capacity == 0) {
          local_324 = (ushort)local_324._1_1_ << 8;
        }
      }
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_298.ld,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_248.ld);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_248.ld,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_338.ld);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)(abStack_2e3 + 0xb),
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_1f8.ld);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::resize(&local_2b8,1,1);
      uVar7 = &local_2b8;
      if (local_2b8.m_internal == false) {
        uVar7 = local_2b8.m_data.ld.data;
      }
      (((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         *)uVar7)->m_data).la[0] = 1;
      local_2b8.m_sign = false;
      local_408.la[0] = (limb_type)&local_1f8;
      local_408.ld.data = (limb_pointer)&local_268;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
      ::operator+=((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_2b8,
                   (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_408.ld);
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&pdVar12->ld,1,1);
      pdVar6 = pdVar12;
      if (local_393 == '\0') {
        pdVar6 = (data_type *)local_3a8._8_8_;
      }
      ((data_type *)&(pdVar6->ld).capacity)->la[0] = 1;
      local_394 = 0;
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign(&local_388,
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_268.ld);
      if (local_388.m_sign != (bool)(byte)local_354) goto joined_r0x003273a7;
      iVar4 = boost::multiprecision::backends::
              cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
              ::
              compare_unsigned<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                        ((cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                          *)&local_388,
                         (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                          *)&local_368.ld);
      iVar3 = -iVar4;
      if (local_388.m_sign == false) {
        iVar3 = iVar4;
      }
      if (iVar3 < 1) {
        do {
          while( true ) {
            if (((byte)local_234 == '\0') && (local_238 == 1)) {
              uVar7 = &local_248;
              if (local_234._1_1_ == '\0') {
                uVar7 = local_248.ld.data;
              }
              if (((data_type *)&((limb_data *)uVar7)->capacity)->la[0] == 0) goto LAB_0032776e;
            }
            boost::multiprecision::backends::
            divide_unsigned_helper<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                      ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                        *)&local_268.ld,
                       (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                        *)&local_298.ld,
                       (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                        *)&local_248.ld,
                       (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                        *)&local_338.ld);
            local_254 = CONCAT11(local_254._1_1_,(char)local_284 != (byte)local_234);
            if (((char)local_284 != (byte)local_234) && (local_258 == 1)) {
              uVar7 = &local_268;
              if (local_254._1_1_ == 0) {
                uVar7 = local_268.ld.data;
              }
              if (*(limb_type *)uVar7 == 0) {
                local_254 = (ushort)local_254._1_1_ << 8;
              }
            }
            local_324 = CONCAT11(local_324._1_1_,(char)local_284);
            if (((char)local_284 != '\0') && (local_328 == 1)) {
              uVar7 = &local_338;
              if (local_324._1_1_ == 0) {
                uVar7 = local_338.ld.data;
              }
              if (*(long *)&((limb_data *)uVar7)->capacity == 0) {
                local_324 = (ushort)local_324._1_1_ << 8;
              }
            }
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_298.ld,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_248.ld);
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_248.ld,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_338.ld);
            local_3b8 = 0;
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_3c8.ld,local_398,local_398);
            uVar7 = &local_3c8;
            if (local_3b4._1_1_ == '\0') {
              uVar7 = local_3c8.ld.data;
            }
            pdVar6 = pdVar12;
            if (local_393 == '\0') {
              pdVar6 = (data_type *)local_3a8._8_8_;
            }
            memcpy((void *)uVar7,pdVar6,(ulong)local_398 << 3);
            local_3b4._0_1_ = local_394;
            local_398 = 0;
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&pdVar12->ld,local_388.m_limbs,local_388.m_limbs);
            pdVar6 = pdVar12;
            if (local_393 == '\0') {
              pdVar6 = (data_type *)local_3a8._8_8_;
            }
            uVar7 = &local_388;
            if (local_388.m_internal == false) {
              uVar7 = local_388.m_data.ld.data;
            }
            memcpy(pdVar6,(void *)uVar7,(ulong)local_388.m_limbs << 3);
            local_394 = local_388.m_sign;
            local_2e8 = 0;
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_2f8.ld,local_2c8,local_2c8);
            uVar7 = &local_2f8;
            if (abStack_2e3[0] == false) {
              uVar7 = local_2f8.ld.data;
            }
            pbVar14 = abStack_2e3 + 0xb;
            if (local_2c3 == '\0') {
              pbVar14 = local_2d0;
            }
            memcpy((void *)uVar7,pbVar14,(ulong)local_2c8 << 3);
            local_2e4 = local_2c4;
            local_2c8 = 0;
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)(abStack_2e3 + 0xb),local_2b8.m_limbs,local_2b8.m_limbs);
            pbVar14 = abStack_2e3 + 0xb;
            if (local_2c3 == '\0') {
              pbVar14 = local_2d0;
            }
            uVar7 = &local_2b8;
            if (local_2b8.m_internal == false) {
              uVar7 = local_2b8.m_data.ld.data;
            }
            memcpy(pbVar14,(void *)uVar7,(ulong)local_2b8.m_limbs << 3);
            local_2c4 = local_2b8.m_sign;
            local_2b8.m_limbs = 0;
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::resize(&local_2b8,local_2e8,local_2e8);
            uVar7 = &local_2b8;
            if (local_2b8.m_internal == false) {
              uVar7 = local_2b8.m_data.ld.data;
            }
            uVar15 = &local_2f8;
            if (abStack_2e3[0] == false) {
              uVar15 = local_2f8.ld.data;
            }
            memcpy((void *)uVar7,(void *)uVar15,(ulong)local_2e8 << 3);
            local_2b8.m_sign = (bool)local_2e4;
            local_408.la[0] = (limb_type)(abStack_2e3 + 0xb);
            local_408.ld.data = (limb_pointer)&local_268;
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
            ::operator+=((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                          *)&local_2b8,
                         (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                          *)&local_408.ld);
            local_388.m_limbs = 0;
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::resize(&local_388,local_3b8,local_3b8);
            uVar7 = &local_388;
            if (local_388.m_internal == false) {
              uVar7 = local_388.m_data.ld.data;
            }
            uVar15 = &local_3c8;
            if (local_3b4._1_1_ == '\0') {
              uVar15 = local_3c8.ld.data;
            }
            memcpy((void *)uVar7,(void *)uVar15,(ulong)local_3b8 << 3);
            local_388.m_sign = (bool)(byte)local_3b4;
            local_408.ld.data = (limb_pointer)&local_268;
            local_408._0_8_ = pdVar12;
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
            ::operator+=((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                          *)&local_388,
                         (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                          *)&local_408.ld);
            if (local_388.m_sign != (bool)(byte)local_354) break;
            iVar4 = boost::multiprecision::backends::
                    cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                    ::
                    compare_unsigned<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                              ((cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                                *)&local_388,
                               (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                                *)&local_368.ld);
            iVar3 = -iVar4;
            if (local_388.m_sign == false) {
              iVar3 = iVar4;
            }
            if (0 < iVar3) goto LAB_0032776e;
          }
joined_r0x003273a7:
        } while (local_388.m_sign != false);
      }
LAB_0032776e:
      if ((local_394 & 1) == 0) {
        local_408.la[0] = 0;
        local_3f8 = 1;
        local_3f4 = 0x100;
        local_3f2 = '\0';
        local_3e8._0_8_ = 1;
        local_3d8 = 1;
        local_3d4._0_1_ = false;
        local_3d4._1_1_ = true;
        local_3d2[0] = false;
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
        ::
        assign<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                    *)&local_408.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)(abStack_2e3 + 0xb),
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&pdVar12->ld);
        uVar17 = local_348;
        pnVar2 = (local_340->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)(pnVar2 + local_348),
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_408.ld);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)((long)&pnVar2[uVar17].m_backend.m_value + 0x20),
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)local_3e8);
        if ((local_3d4._1_1_ == false) && (local_3d2[0] == false)) {
          operator_delete((void *)local_3e8._8_8_,(local_3e8._0_8_ & 0xffffffff) << 3);
        }
        if ((local_3f4._1_1_ == '\0') && (local_3f2 == '\0')) {
          operator_delete(local_408.ld.data,(local_408.la[0] & 0xffffffff) << 3);
        }
      }
      else {
        local_38.arg = (type)(abStack_2e3 + 0xb);
        local_408.la[0] = 0;
        local_3f8 = 1;
        local_3f4 = 0x100;
        local_3f2 = '\0';
        local_3e8._0_8_ = 1;
        local_3d8 = 1;
        local_3d4._0_1_ = false;
        local_3d4._1_1_ = true;
        local_3d2[0] = false;
        local_40.arg = (type)pdVar12;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::negate,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void,void>
                  ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_88.ld,&local_38,(type *)0x0);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::negate,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void,void>
                  ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                    *)local_68,&local_40,(type *)0x0);
        boost::
        rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
        ::
        assign<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                  ((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                    *)&local_408.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_88.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)local_68);
        if ((local_53 == '\0') && (local_52 == '\0')) {
          operator_delete(local_60,(ulong)local_68[0] << 3);
        }
        if ((local_73 == '\0') && (local_72 == '\0')) {
          operator_delete(local_88.ld.data,(local_88.la[0] & 0xffffffff) << 3);
        }
        uVar17 = local_348;
        pnVar2 = (local_340->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)(pnVar2 + local_348),
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)&local_408.ld);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::operator=((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)((long)&pnVar2[uVar17].m_backend.m_value + 0x20),
                    (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                     *)local_3e8);
        if ((local_3d4._1_1_ == false) && (local_3d2[0] == false)) {
          operator_delete((void *)local_3e8._8_8_,(local_3e8._0_8_ & 0xffffffff) << 3);
        }
        if ((local_3f4._1_1_ == '\0') && (local_3f2 == '\0')) {
          operator_delete(local_408.ld.data,(local_408.la[0] & 0xffffffff) << 3);
        }
      }
      local_1c8.la[0] = 0;
      local_1b8 = 0;
      if (local_212 != 0) {
        local_1b8 = local_218;
      }
      local_1b4 = (byte)local_214;
      local_1b3 = local_212 ^ 1;
      local_1b2 = local_212;
      if (local_212 == 1) {
        local_1c8.la[0] = local_228.la[0];
        local_1c8.ld.data = local_228.ld.data;
      }
      else {
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_1c8.ld,local_218,local_218);
        uVar7 = &local_1c8;
        if (local_1b3 == 0) {
          uVar7 = local_1c8.ld.data;
        }
        uVar15 = &local_228;
        if (local_214._1_1_ == '\0') {
          uVar15 = local_228.ld.data;
        }
        memcpy((void *)uVar7,(void *)uVar15,(ulong)local_218 << 3);
      }
      pnVar2 = (local_340->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar11 = (number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                 *)((long)&pnVar2[local_348].m_backend.m_value + 0x20);
      local_188.la[0] = 0;
      local_172 = *(bool *)((long)&pnVar2[local_348].m_backend.m_value + 0x36);
      uVar1 = *(uint *)((long)&pnVar2[local_348].m_backend.m_value + 0x30);
      local_178 = 0;
      if ((bool)local_172 != false) {
        local_178 = uVar1;
      }
      local_174 = *(bool *)((long)&pnVar2[local_348].m_backend.m_value + 0x34);
      local_173 = local_172 ^ 1;
      if ((bool)local_172 == true) {
        local_188.la[0] =
             *(undefined8 *)
              &(pnVar11->m_backend).
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ;
        local_188.ld.data =
             (limb_pointer)*(undefined8 *)((long)&pnVar2[local_348].m_backend.m_value + 0x28);
        local_348 = local_348 * 0x40;
      }
      else {
        local_348 = local_348 * 0x40;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_188.ld,uVar1,uVar1);
        uVar7 = &local_188;
        if (local_173 == 0) {
          uVar7 = local_188.ld.data;
        }
        if (*(char *)((long)&(pnVar2->m_backend).m_value + local_348 + 0x35) == '\0') {
          pnVar11 = *(number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                      **)((long)&(pnVar2->m_backend).m_value + local_348 + 0x28);
        }
        memcpy((void *)uVar7,pnVar11,
               (ulong)*(uint *)((long)&(pnVar2->m_backend).m_value + local_348 + 0x30) << 3);
      }
      boost::multiprecision::backends::
      eval_gcd<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_338.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_1c8.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_188.ld);
      pnVar16 = local_270;
      if ((local_173 == 0) && (local_172 == 0)) {
        operator_delete(local_188.ld.data,(local_188.la[0] & 0xffffffff) << 3);
      }
      if ((local_1b3 == 0) && (local_1b2 == 0)) {
        operator_delete(local_1c8.ld.data,(local_1c8.la[0] & 0xffffffff) << 3);
      }
      boost::multiprecision::backends::
      eval_multiply<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_228.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_228,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_338.ld);
      if ((byte)local_214 == (byte)local_354) {
        iVar4 = boost::multiprecision::backends::
                cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                ::
                compare_unsigned<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                          ((cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                            *)&local_228.ld,
                           (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                            *)&local_368.ld);
        iVar3 = -iVar4;
        if ((byte)local_214 == '\0') {
          iVar3 = iVar4;
        }
        if (0 < iVar3) goto LAB_00327c20;
      }
      else if ((byte)local_214 == 0) {
LAB_00327c20:
        bVar10 = false;
LAB_00327c22:
        lVar8 = 0x60;
        do {
          if ((local_3d2[lVar8 + -1] == false) && (local_3d2[lVar8] == false)) {
            operator_delete(*(void **)(local_3e8 + lVar8 + 8),
                            (ulong)*(uint *)(local_3e8 + lVar8) << 3);
          }
          lVar8 = lVar8 + -0x20;
        } while (lVar8 != 0);
        lVar8 = 0x60;
        do {
          if ((local_302[lVar8 + -1] == false) && (local_302[lVar8] == false)) {
            operator_delete(*(void **)(local_318 + lVar8 + 8),
                            (ulong)*(uint *)(local_318 + lVar8) << 3);
          }
          lVar8 = lVar8 + -0x20;
        } while (lVar8 != 0);
        if ((local_254._1_1_ == '\0') && (local_252 == '\0')) {
          operator_delete(local_268.ld.data,(local_268.la[0] & 0xffffffff) << 3);
        }
        if ((local_1e4._1_1_ == '\0') && (local_1e2 == '\0')) {
          operator_delete(local_1f8.ld.data,(local_1f8.la[0] & 0xffffffff) << 3);
        }
        if ((local_214._1_1_ == '\0') && (local_212 == 0)) {
          operator_delete(local_228.ld.data,(local_228.la[0] & 0xffffffff) << 3);
        }
        if ((local_354._1_1_ == '\0') && (local_352 == '\0')) {
          operator_delete(local_368.ld.data,(local_368.la[0] & 0xffffffff) << 3);
        }
        if ((local_284._1_1_ == '\0') && (local_282 == 0)) {
          operator_delete(local_298.ld.data,(local_298.la[0] & 0xffffffff) << 3);
        }
        if ((local_234._1_1_ == '\0') && (local_232 == 0)) {
          operator_delete(local_248.ld.data,(local_248.la[0] & 0xffffffff) << 3);
        }
        if ((local_324._1_1_ == '\0') && (local_322 == '\0')) {
          operator_delete(local_338.ld.data,(local_338.la[0] & 0xffffffff) << 3);
        }
        if ((local_193 == 0) && (local_192 == 0)) {
          operator_delete(local_1a8.ld.data,(local_1a8.la[0] & 0xffffffff) << 3);
        }
        if ((local_304._1_1_ == false) && (local_302[0] == false)) {
          operator_delete((void *)local_318._8_8_,(local_318._0_8_ & 0xffffffff) << 3);
        }
        std::
        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        ::~vector(&local_a0);
        return bVar10;
      }
    }
LAB_00327c13:
    local_200 = local_200 + 1;
  } while( true );
}

Assistant:

inline bool reconstructVector(VectorRational& input, const Rational& denomBoundSquared,
                              const DIdxSet* indexSet)
{
   std::vector<Integer> xnum(input.dim()); /* numerator of input vector */
   Integer denom = 1; /* common denominator of input vector */
   int rval = true;
   int dim;

   dim = input.dim();

   /* find common denominator */
   if(indexSet == nullptr)
   {
      for(int i = 0; i < dim; i++)
         SpxLcm(denom, denom, denominator(input[i]));

      for(int i = 0; i < dim; i++)
      {
         xnum[i] = denom * Integer(numerator(input[i]));
         xnum[i] = xnum[i] / Integer(denominator(input[i]));
      }
   }
   else
   {
      for(int i = 0; i < indexSet->size(); i++)
      {
         assert(indexSet->index(i) >= 0);
         assert(indexSet->index(i) < input.dim());
         SpxLcm(denom, denom, denominator(input[indexSet->index(i)]));
      }

      for(int i = 0; i < indexSet->size(); i++)
      {
         int k = indexSet->index(i);
         assert(k >= 0);
         assert(k < input.dim());
         xnum[k] = denom * Integer(numerator(input[k]));
         xnum[k] = xnum[k] / Integer(denominator(input[k]));
      }
   }

   SPxOut::debug(&input, "LCM = {}\n", denom);

   /* reconstruct */
   rval = Reconstruct(input, xnum.data(), denom, dim, denomBoundSquared, indexSet);

   return rval;
}